

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<unsigned_char,std::allocator<unsigned_char>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
          (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end,uchar in_whitespace)

{
  jessilib jVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var2;
  pointer puVar3;
  pointer puVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  allocator_type local_79;
  pointer local_78;
  pointer puStack_70;
  pointer puStack_68;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  pointer puStack_30;
  
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  puStack_50 = (pointer)0x0;
  if (this < begin._M_current) {
    jVar1 = SUB81(end._M_current,0);
    do {
      __last._M_current = (uchar *)this;
      _Var2._M_current = (uchar *)this;
      if (*this != jVar1) break;
      this = this + 1;
      __last._M_current = begin._M_current;
      _Var2._M_current = begin._M_current;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (__last._M_current == begin._M_current) goto LAB_00400677;
      if ((jessilib)*__last._M_current == jVar1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,_Var2,__last,
                   &local_79);
        puVar3 = local_48;
        puVar4 = local_58;
        local_58 = local_78;
        puStack_50 = puStack_70;
        local_48 = puStack_68;
        local_78 = (pointer)0x0;
        puStack_70 = (pointer)0x0;
        puStack_68 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4,(long)puVar3 - (long)puVar4);
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78,(long)puStack_68 - (long)local_78);
        }
        goto LAB_00400735;
      }
      __last._M_current = __last._M_current + 1;
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  goto LAB_004007d2;
LAB_00400677:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,_Var2,begin,&local_79)
  ;
  puVar3 = local_48;
  puVar4 = local_58;
  local_58 = local_78;
  puStack_50 = puStack_70;
  local_48 = puStack_68;
  goto LAB_0040077e;
  while (_Var2._M_current = __last._M_current, (jessilib)*__last._M_current == jVar1) {
LAB_00400735:
    __last._M_current = __last._M_current + 1;
    _Var2._M_current = begin._M_current;
    if (__last._M_current == begin._M_current) break;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,_Var2,begin,&local_79)
  ;
  puVar3 = puStack_30;
  puVar4 = puStack_40;
  puStack_40 = local_78;
  local_38 = puStack_70;
  puStack_30 = puStack_68;
LAB_0040077e:
  local_78 = (pointer)0x0;
  puStack_70 = (pointer)0x0;
  puStack_68 = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar3 - (long)puVar4);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)puStack_68 - (long)local_78);
  }
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_50;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
LAB_004007d2:
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = puStack_40;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_38;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}